

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderStateQueryTests.cpp
# Opt level: O2

void __thiscall
deqp::gles3::Functional::anon_unknown_0::ProgramActiveUniformBlocksCase::test
          (ProgramActiveUniformBlocksCase *this)

{
  CallLogWrapper *this_00;
  ostringstream *poVar1;
  int iVar2;
  GLuint GVar3;
  GLuint GVar4;
  GLuint GVar5;
  TestContext *pTVar6;
  allocator<char> local_8e1;
  GLuint local_8e0;
  GLuint local_8dc;
  GLuint local_8d8;
  GLuint local_8d4;
  StateQueryMemoryWriteGuard<int[2]> longlongUniformBlockUniformIndices;
  StateQueryMemoryWriteGuard<int> longlongUniformBlockUniforms;
  StateQueryMemoryWriteGuard<int[3]> uniformsBlockIndices;
  StateQueryMemoryWriteGuard<unsigned_int[3]> uniformIndices;
  char *uniformNames [3];
  char buffer [2048];
  
  this_00 = &(this->super_ApiCase).super_CallLogWrapper;
  GVar3 = glu::CallLogWrapper::glCreateShader(this_00,0x8b31);
  GVar4 = glu::CallLogWrapper::glCreateShader(this_00,0x8b30);
  glu::CallLogWrapper::glShaderSource(this_00,GVar3,1,&test::testVertSource,(GLint *)0x0);
  glu::CallLogWrapper::glShaderSource(this_00,GVar4,1,&test::testFragSource,(GLint *)0x0);
  glu::CallLogWrapper::glCompileShader(this_00,GVar3);
  glu::CallLogWrapper::glCompileShader(this_00,GVar4);
  ApiCase::expectError(&this->super_ApiCase,0);
  GVar5 = glu::CallLogWrapper::glCreateProgram(this_00);
  glu::CallLogWrapper::glAttachShader(this_00,GVar5,GVar3);
  glu::CallLogWrapper::glAttachShader(this_00,GVar5,GVar4);
  glu::CallLogWrapper::glLinkProgram(this_00,GVar5);
  ApiCase::expectError(&this->super_ApiCase,0);
  verifyShaderParam((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
                    this_00,GVar3,0x8b81,1);
  local_8d8 = GVar4;
  verifyShaderParam((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
                    this_00,GVar4,0x8b81,1);
  verifyProgramParam((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
                     this_00,GVar5,0x8b82,1);
  verifyProgramParam((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
                     this_00,GVar5,0x8a36,2);
  pTVar6 = (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)buffer,"longlongUniformBlockName",(allocator<char> *)&uniformIndices);
  local_8d4 = GVar3;
  verifyProgramParam(pTVar6,this_00,GVar5,0x8a35,buffer._8_4_ + 1);
  std::__cxx11::string::~string((string *)buffer);
  ApiCase::expectError(&this->super_ApiCase,0);
  GVar4 = glu::CallLogWrapper::glGetUniformBlockIndex(this_00,GVar5,"longlongUniformBlockName");
  local_8dc = glu::CallLogWrapper::glGetUniformBlockIndex(this_00,GVar5,"shortUniformBlockName");
  uniformNames[2] = "shortUniformBlockName.vector4";
  uniformNames[0] = "longlongUniformBlockName.vector2";
  uniformNames[1] = "shortUniformBlockName.vector2";
  deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<unsigned_int[3]>::StateQueryMemoryWriteGuard
            (&uniformIndices);
  deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int[3]>::StateQueryMemoryWriteGuard
            (&uniformsBlockIndices);
  glu::CallLogWrapper::glGetUniformIndices(this_00,GVar5,3,uniformNames,uniformIndices.m_value);
  deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<unsigned_int[3]>::verifyValidity
            (&uniformIndices,
             (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx);
  ApiCase::expectError(&this->super_ApiCase,0);
  local_8e0 = GVar5;
  glu::CallLogWrapper::glGetActiveUniformsiv
            (this_00,GVar5,3,uniformIndices.m_value,0x8a3a,uniformsBlockIndices.m_value);
  deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int[3]>::verifyValidity
            (&uniformsBlockIndices,
             (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx);
  ApiCase::expectError(&this->super_ApiCase,0);
  GVar3 = local_8dc;
  pTVar6 = (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx;
  if (((uniformsBlockIndices.m_value[0] != GVar4) || (uniformsBlockIndices.m_value[1] != local_8dc))
     || (GVar5 = local_8e0, uniformsBlockIndices.m_value[2] != local_8dc)) {
    buffer._0_8_ = pTVar6->m_log;
    poVar1 = (ostringstream *)(buffer + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,"// ERROR: Expected [");
    std::ostream::operator<<(poVar1,GVar4);
    std::operator<<((ostream *)poVar1,", ");
    std::ostream::operator<<(poVar1,GVar3);
    std::operator<<((ostream *)poVar1,", ");
    std::ostream::operator<<(poVar1,GVar3);
    std::operator<<((ostream *)poVar1,"];");
    std::operator<<((ostream *)poVar1,"got [");
    std::ostream::operator<<(poVar1,uniformsBlockIndices.m_value[0]);
    std::operator<<((ostream *)poVar1,", ");
    std::ostream::operator<<(poVar1,uniformsBlockIndices.m_value[1]);
    std::operator<<((ostream *)poVar1,", ");
    std::ostream::operator<<(poVar1,uniformsBlockIndices.m_value[2]);
    std::operator<<((ostream *)poVar1,"]");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)buffer,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    GVar5 = local_8e0;
    pTVar6 = (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx;
    if (pTVar6->m_testResult == QP_TEST_RESULT_PASS) {
      tcu::TestContext::setTestResult(pTVar6,QP_TEST_RESULT_FAIL,"got wrong uniform block index");
      pTVar6 = (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx;
    }
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)buffer,"longlongUniformBlockName",
             (allocator<char> *)&longlongUniformBlockUniformIndices);
  verifyActiveUniformBlockParam(pTVar6,this_00,GVar5,GVar4,0x8a41,buffer._8_4_ + 1);
  std::__cxx11::string::~string((string *)buffer);
  pTVar6 = (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)buffer,"shortUniformBlockName",
             (allocator<char> *)&longlongUniformBlockUniformIndices);
  verifyActiveUniformBlockParam(pTVar6,this_00,GVar5,GVar3,0x8a41,buffer._8_4_ + 1);
  std::__cxx11::string::~string((string *)buffer);
  ApiCase::expectError(&this->super_ApiCase,0);
  verifyActiveUniformBlockParam
            ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,this_00,
             GVar5,GVar4,0x8a44,1);
  verifyActiveUniformBlockParam
            ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,this_00,
             GVar5,GVar4,0x8a46,1);
  verifyActiveUniformBlockParam
            ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,this_00,
             GVar5,GVar3,0x8a44,1);
  verifyActiveUniformBlockParam
            ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,this_00,
             GVar5,GVar3,0x8a46,0);
  ApiCase::expectError(&this->super_ApiCase,0);
  verifyActiveUniformBlockParam
            ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,this_00,
             GVar5,GVar4,0x8a42,1);
  verifyActiveUniformBlockParam
            ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,this_00,
             GVar5,GVar3,0x8a42,2);
  ApiCase::expectError(&this->super_ApiCase,0);
  deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int>::StateQueryMemoryWriteGuard
            (&longlongUniformBlockUniforms);
  glu::CallLogWrapper::glGetActiveUniformBlockiv
            (this_00,GVar5,GVar4,0x8a42,&longlongUniformBlockUniforms.m_value);
  deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int>::verifyValidity
            (&longlongUniformBlockUniforms,
             (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx);
  if (longlongUniformBlockUniforms.m_value == 2) {
    deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int[2]>::StateQueryMemoryWriteGuard
              (&longlongUniformBlockUniformIndices);
    glu::CallLogWrapper::glGetActiveUniformBlockiv
              (this_00,GVar5,GVar4,0x8a43,longlongUniformBlockUniformIndices.m_value);
    deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int[2]>::verifyValidity
              (&longlongUniformBlockUniformIndices,
               (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx);
    if ((longlongUniformBlockUniformIndices.m_value[1] != uniformIndices.m_value[1] ||
         longlongUniformBlockUniformIndices.m_value[0] != uniformIndices.m_value[0]) &&
       (longlongUniformBlockUniformIndices.m_value[0] != uniformIndices.m_value[1] ||
        longlongUniformBlockUniformIndices.m_value[1] != uniformIndices.m_value[0])) {
      buffer._0_8_ = ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)
                     ->m_log;
      poVar1 = (ostringstream *)(buffer + 8);
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::operator<<((ostream *)poVar1,"// ERROR: Expected {");
      std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      std::operator<<((ostream *)poVar1,", ");
      std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      std::operator<<((ostream *)poVar1,"};");
      std::operator<<((ostream *)poVar1,"got {");
      std::ostream::operator<<(poVar1,longlongUniformBlockUniformIndices.m_value[0]);
      std::operator<<((ostream *)poVar1,", ");
      std::ostream::operator<<(poVar1,longlongUniformBlockUniformIndices.m_value[1]);
      std::operator<<((ostream *)poVar1,"}");
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)buffer,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      pTVar6 = (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx;
      if (pTVar6->m_testResult == QP_TEST_RESULT_PASS) {
        tcu::TestContext::setTestResult(pTVar6,QP_TEST_RESULT_FAIL,"got wrong uniform indices");
      }
    }
  }
  memset(buffer,0,0x800);
  buffer[0] = 'x';
  longlongUniformBlockUniforms.m_preguard = 0;
  local_8e0 = GVar4;
  glu::CallLogWrapper::glGetActiveUniformBlockName
            (this_00,GVar5,GVar4,0x800,&longlongUniformBlockUniforms.m_preguard,buffer);
  iVar2 = longlongUniformBlockUniforms.m_preguard;
  pTVar6 = (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&longlongUniformBlockUniformIndices,"longlongUniformBlockName",&local_8e1);
  checkIntEquals(pTVar6,iVar2,longlongUniformBlockUniformIndices.m_value[0]);
  std::__cxx11::string::~string((string *)&longlongUniformBlockUniformIndices);
  longlongUniformBlockUniforms.m_preguard = 0;
  glu::CallLogWrapper::glGetActiveUniformBlockName
            (this_00,GVar5,local_8dc,0x800,&longlongUniformBlockUniforms.m_preguard,buffer);
  iVar2 = longlongUniformBlockUniforms.m_preguard;
  pTVar6 = (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&longlongUniformBlockUniformIndices,"shortUniformBlockName",&local_8e1);
  checkIntEquals(pTVar6,iVar2,longlongUniformBlockUniformIndices.m_value[0]);
  GVar3 = local_8d4;
  std::__cxx11::string::~string((string *)&longlongUniformBlockUniformIndices);
  longlongUniformBlockUniforms.m_preguard = 0;
  glu::CallLogWrapper::glGetActiveUniformBlockName
            (this_00,GVar5,local_8e0,1,&longlongUniformBlockUniforms.m_preguard,buffer);
  checkIntEquals((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
                 longlongUniformBlockUniforms.m_preguard,0);
  ApiCase::expectError(&this->super_ApiCase,0);
  glu::CallLogWrapper::glDeleteShader(this_00,GVar3);
  glu::CallLogWrapper::glDeleteShader(this_00,local_8d8);
  glu::CallLogWrapper::glDeleteProgram(this_00,GVar5);
  ApiCase::expectError(&this->super_ApiCase,0);
  return;
}

Assistant:

void test (void)
	{
		using tcu::TestLog;

		static const char* testVertSource =
			"#version 300 es\n"
			"uniform longlongUniformBlockName {highp vec2 vector2;} longlongUniformInstanceName;\n"
			"uniform shortUniformBlockName {highp vec2 vector2;highp vec4 vector4;} shortUniformInstanceName;\n"
			"void main (void)\n"
			"{\n"
			"	gl_Position = shortUniformInstanceName.vector4 + vec4(longlongUniformInstanceName.vector2.x) + vec4(shortUniformInstanceName.vector2.x);\n"
			"}\n\0";
		static const char* testFragSource =
			"#version 300 es\n"
			"uniform longlongUniformBlockName {highp vec2 vector2;} longlongUniformInstanceName;\n"
			"layout(location = 0) out mediump vec4 fragColor;"
			"void main (void)\n"
			"{\n"
			"	fragColor = vec4(longlongUniformInstanceName.vector2.y);\n"
			"}\n\0";

		GLuint shaderVert = glCreateShader(GL_VERTEX_SHADER);
		GLuint shaderFrag = glCreateShader(GL_FRAGMENT_SHADER);

		glShaderSource(shaderVert, 1, &testVertSource, DE_NULL);
		glShaderSource(shaderFrag, 1, &testFragSource, DE_NULL);

		glCompileShader(shaderVert);
		glCompileShader(shaderFrag);
		expectError(GL_NO_ERROR);

		GLuint program = glCreateProgram();
		glAttachShader(program, shaderVert);
		glAttachShader(program, shaderFrag);
		glLinkProgram(program);
		expectError(GL_NO_ERROR);

		verifyShaderParam	(m_testCtx, *this, shaderVert,	GL_COMPILE_STATUS,	GL_TRUE);
		verifyShaderParam	(m_testCtx, *this, shaderFrag,	GL_COMPILE_STATUS,	GL_TRUE);
		verifyProgramParam	(m_testCtx, *this, program,		GL_LINK_STATUS,		GL_TRUE);

		verifyProgramParam	(m_testCtx, *this, program,		GL_ACTIVE_UNIFORM_BLOCKS, 2);
		verifyProgramParam	(m_testCtx, *this, program,		GL_ACTIVE_UNIFORM_BLOCK_MAX_NAME_LENGTH, (GLint)std::string("longlongUniformBlockName").length() + 1); // including a null terminator
		expectError(GL_NO_ERROR);

		GLint longlongUniformBlockIndex	= glGetUniformBlockIndex(program, "longlongUniformBlockName");
		GLint shortUniformBlockIndex	= glGetUniformBlockIndex(program, "shortUniformBlockName");

		const char* uniformNames[] =
		{
			"longlongUniformBlockName.vector2",
			"shortUniformBlockName.vector2",
			"shortUniformBlockName.vector4"
		};

		// test UNIFORM_BLOCK_INDEX

		DE_STATIC_ASSERT(DE_LENGTH_OF_ARRAY(uniformNames) == 3);

		StateQueryMemoryWriteGuard<GLuint[DE_LENGTH_OF_ARRAY(uniformNames)]> uniformIndices;
		StateQueryMemoryWriteGuard<GLint[DE_LENGTH_OF_ARRAY(uniformNames)]> uniformsBlockIndices;

		glGetUniformIndices(program, DE_LENGTH_OF_ARRAY(uniformNames), uniformNames, uniformIndices);
		uniformIndices.verifyValidity(m_testCtx);
		expectError(GL_NO_ERROR);

		glGetActiveUniformsiv(program, DE_LENGTH_OF_ARRAY(uniformNames), uniformIndices, GL_UNIFORM_BLOCK_INDEX, uniformsBlockIndices);
		uniformsBlockIndices.verifyValidity(m_testCtx);
		expectError(GL_NO_ERROR);

		if (uniformsBlockIndices[0] != longlongUniformBlockIndex ||
			uniformsBlockIndices[1] != shortUniformBlockIndex ||
			uniformsBlockIndices[2] != shortUniformBlockIndex)
		{
			m_testCtx.getLog() << TestLog::Message
				<< "// ERROR: Expected ["	<< longlongUniformBlockIndex	<< ", " << shortUniformBlockIndex	<< ", " << shortUniformBlockIndex	<< "];"
				<<	"got ["					<< uniformsBlockIndices[0]		<< ", " << uniformsBlockIndices[1]	<< ", " << uniformsBlockIndices[2]	<< "]" << TestLog::EndMessage;
			if (m_testCtx.getTestResult() == QP_TEST_RESULT_PASS)
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "got wrong uniform block index");
		}

		// test UNIFORM_BLOCK_NAME_LENGTH

		verifyActiveUniformBlockParam(m_testCtx, *this, program, longlongUniformBlockIndex,	GL_UNIFORM_BLOCK_NAME_LENGTH, (GLint)std::string("longlongUniformBlockName").length() + 1); // including null-terminator
		verifyActiveUniformBlockParam(m_testCtx, *this, program, shortUniformBlockIndex,	GL_UNIFORM_BLOCK_NAME_LENGTH, (GLint)std::string("shortUniformBlockName").length() + 1); // including null-terminator
		expectError(GL_NO_ERROR);

		// test UNIFORM_BLOCK_REFERENCED_BY_VERTEX_SHADER & UNIFORM_BLOCK_REFERENCED_BY_FRAGMENT_SHADER

		verifyActiveUniformBlockParam(m_testCtx, *this, program, longlongUniformBlockIndex,	GL_UNIFORM_BLOCK_REFERENCED_BY_VERTEX_SHADER,	GL_TRUE);
		verifyActiveUniformBlockParam(m_testCtx, *this, program, longlongUniformBlockIndex,	GL_UNIFORM_BLOCK_REFERENCED_BY_FRAGMENT_SHADER,	GL_TRUE);
		verifyActiveUniformBlockParam(m_testCtx, *this, program, shortUniformBlockIndex,	GL_UNIFORM_BLOCK_REFERENCED_BY_VERTEX_SHADER,	GL_TRUE);
		verifyActiveUniformBlockParam(m_testCtx, *this, program, shortUniformBlockIndex,	GL_UNIFORM_BLOCK_REFERENCED_BY_FRAGMENT_SHADER,	GL_FALSE);
		expectError(GL_NO_ERROR);

		// test UNIFORM_BLOCK_ACTIVE_UNIFORMS

		verifyActiveUniformBlockParam(m_testCtx, *this, program, longlongUniformBlockIndex,	GL_UNIFORM_BLOCK_ACTIVE_UNIFORMS,	1);
		verifyActiveUniformBlockParam(m_testCtx, *this, program, shortUniformBlockIndex,	GL_UNIFORM_BLOCK_ACTIVE_UNIFORMS,	2);
		expectError(GL_NO_ERROR);

		// test UNIFORM_BLOCK_ACTIVE_UNIFORM_INDICES

		{
			StateQueryMemoryWriteGuard<GLint> longlongUniformBlockUniforms;
			glGetActiveUniformBlockiv(program, longlongUniformBlockIndex, GL_UNIFORM_BLOCK_ACTIVE_UNIFORMS, &longlongUniformBlockUniforms);
			longlongUniformBlockUniforms.verifyValidity(m_testCtx);

			if (longlongUniformBlockUniforms == 2)
			{
				StateQueryMemoryWriteGuard<GLint[2]> longlongUniformBlockUniformIndices;
				glGetActiveUniformBlockiv(program, longlongUniformBlockIndex, GL_UNIFORM_BLOCK_ACTIVE_UNIFORM_INDICES, longlongUniformBlockUniformIndices);
				longlongUniformBlockUniformIndices.verifyValidity(m_testCtx);

				if ((GLuint(longlongUniformBlockUniformIndices[0]) != uniformIndices[0] || GLuint(longlongUniformBlockUniformIndices[1]) != uniformIndices[1]) &&
					(GLuint(longlongUniformBlockUniformIndices[1]) != uniformIndices[0] || GLuint(longlongUniformBlockUniformIndices[0]) != uniformIndices[1]))
				{
					m_testCtx.getLog() << TestLog::Message
						<< "// ERROR: Expected {"	<< uniformIndices[0]						<< ", " << uniformIndices[1] << "};"
						<<	"got {"					<< longlongUniformBlockUniformIndices[0]	<< ", " << longlongUniformBlockUniformIndices[1] << "}" << TestLog::EndMessage;

					if (m_testCtx.getTestResult() == QP_TEST_RESULT_PASS)
						m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "got wrong uniform indices");
				}

			}
		}

		// check block names

		{
			char buffer[2048] = {'x'};
			GLint written = 0;
			glGetActiveUniformBlockName(program, longlongUniformBlockIndex, DE_LENGTH_OF_ARRAY(buffer), &written, buffer);
			checkIntEquals(m_testCtx, written, (GLint)std::string("longlongUniformBlockName").length());

			written = 0;
			glGetActiveUniformBlockName(program, shortUniformBlockIndex, DE_LENGTH_OF_ARRAY(buffer), &written, buffer);
			checkIntEquals(m_testCtx, written, (GLint)std::string("shortUniformBlockName").length());

			// and one with too small buffer
			written = 0;
			glGetActiveUniformBlockName(program, longlongUniformBlockIndex, 1, &written, buffer);
			checkIntEquals(m_testCtx, written, 0);
		}

		expectError(GL_NO_ERROR);
		glDeleteShader(shaderVert);
		glDeleteShader(shaderFrag);
		glDeleteProgram(program);
		expectError(GL_NO_ERROR);
	}